

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O1

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::addControlDependencies
          (SDGDependenciesBuilder *this,DGBBlock *block,BasicBlock *B)

{
  pointer ppVVar1;
  ValVec local_38;
  
  LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>(&local_38,this->CDA,B);
  for (ppVVar1 = local_38.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar1 !=
      local_38.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar1 = ppVVar1 + 1) {
    addControlDep(this,&block->super_DepDGElement,*ppVVar1);
  }
  if (local_38.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addControlDependencies(sdg::DGBBlock *block, llvm::BasicBlock &B) {
        assert(block);
        for (auto *dep : CDA->getDependencies(&B)) {
            addControlDep(block, dep);
        }
    }